

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  Scope SVar1;
  Scope SVar2;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t cluster_size_15;
  GroupOperation operation_16;
  uint32_t cluster_size_14;
  GroupOperation operation_15;
  uint32_t cluster_size_13;
  GroupOperation operation_14;
  uint32_t cluster_size_12;
  GroupOperation operation_13;
  uint32_t cluster_size_11;
  GroupOperation operation_12;
  uint32_t cluster_size_10;
  GroupOperation operation_11;
  uint32_t cluster_size_9;
  GroupOperation operation_10;
  uint32_t cluster_size_8;
  GroupOperation operation_9;
  uint32_t cluster_size_7;
  GroupOperation operation_8;
  uint32_t cluster_size_6;
  GroupOperation operation_7;
  uint32_t cluster_size_5;
  GroupOperation operation_6;
  uint32_t cluster_size_4;
  GroupOperation operation_5;
  uint32_t cluster_size_3;
  GroupOperation operation_4;
  uint32_t cluster_size_2;
  GroupOperation operation_3;
  uint32_t cluster_size_1;
  GroupOperation operation_2;
  uint32_t cluster_size;
  GroupOperation operation_1;
  GroupOperation operation;
  allocator local_99;
  string local_98;
  uint32_t local_78;
  Scope local_74;
  Scope scope;
  uint32_t id;
  uint32_t result_type;
  uint32_t op_idx;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  uint local_24;
  Scope *pSStack_20;
  Op op;
  uint32_t *ops;
  Instruction *i_local;
  CompilerMSL *this_local;
  
  ops = (uint32_t *)i;
  i_local = (Instruction *)this;
  pSStack_20 = Compiler::stream((Compiler *)this,i);
  local_24 = (uint)(ushort)*ops;
  if (((this->msl_options).emulate_subgroups & 1U) != 0) {
    if (local_24 == 0x14d) {
      SVar1 = *pSStack_20;
      SVar2 = pSStack_20[1];
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&integer_width,"true",(allocator *)((long)&int_type + 3));
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,SVar1,SVar2,(string *)&integer_width,true,false);
      ::std::__cxx11::string::~string((string *)&integer_width);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&int_type + 3));
      return;
    }
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar5,"Subgroup emulation does not support operations other than Elect.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar3 = Options::supports_msl_version(&this->msl_options,2,0,0);
  if (!bVar3) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Subgroups are only supported in Metal 2.0 and up.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uint_type = CompilerGLSL::get_integer_width_for_instruction
                        (&this->super_CompilerGLSL,(Instruction *)ops);
  op_idx = to_signed_basetype(uint_type);
  result_type = to_unsigned_basetype(uint_type);
  bVar3 = Options::is_ios(&this->msl_options);
  if ((bVar3) &&
     ((bVar3 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar3 ||
      (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)))) {
    if (local_24 == 0x14d) {
      bVar3 = Options::supports_msl_version(&this->msl_options,2,2,0);
      if (!bVar3) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Elect on iOS requires Metal 2.2 and up.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    else {
      if (local_24 - 0x14e < 3) goto LAB_00392686;
      if (local_24 != 0x151) {
        if (local_24 == 0x152) {
          bVar3 = Options::supports_msl_version(&this->msl_options,2,2,0);
          if (!bVar3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"BroadcastFirst on iOS requires Metal 2.2 and up.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        else if (local_24 - 0x153 < 6) {
LAB_00392686:
          bVar3 = Options::supports_msl_version(&this->msl_options,2,2,0);
          if (!bVar3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Ballot ops on iOS requires Metal 2.2 and up.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        else if ((3 < local_24 - 0x159) && (1 < local_24 - 0x16d)) {
          if ((local_24 == 0x1145) || (local_24 - 0x114c < 3)) goto LAB_00392686;
          if (local_24 != 0x1150) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up."
                      );
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
      }
    }
  }
  bVar3 = Options::is_macos(&this->msl_options);
  if ((((bVar3) && (bVar3 = Options::supports_msl_version(&this->msl_options,2,1,0), !bVar3)) &&
      (local_24 != 0x151)) && ((3 < local_24 - 0x159 && (local_24 != 0x1150)))) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar5,"Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up."
              );
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  scope = *pSStack_20;
  id = 2;
  local_74 = pSStack_20[1];
  if (((local_24 - 0x1145 < 2) || (local_24 - 0x114c < 3)) || (local_24 == 0x1150)) {
    local_78 = 3;
  }
  else {
    id = 3;
    local_78 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[2]);
  }
  if (local_78 != 3) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Only subgroup scope is supported.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (local_24 == 0x14d) {
    bVar3 = Options::use_quadgroup_operation(&this->msl_options);
    SVar2 = scope;
    SVar1 = local_74;
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_98,"quad_is_first()",&local_99);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,SVar2,SVar1,&local_98,false,false);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&operation,"simd_is_first()",(allocator *)((long)&operation_1 + 3));
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,SVar2,SVar1,(string *)&operation,false,false);
      ::std::__cxx11::string::~string((string *)&operation);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&operation_1 + 3));
    }
    goto LAB_00395485;
  }
  if (local_24 == 0x14e) {
LAB_003930d5:
    bVar3 = Options::use_quadgroup_operation(&this->msl_options);
    if (bVar3) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_all");
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"simd_all");
    }
    goto LAB_00395485;
  }
  if (local_24 == 0x14f) {
LAB_0039313b:
    bVar3 = Options::use_quadgroup_operation(&this->msl_options);
    if (bVar3) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_any");
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"simd_any");
    }
    goto LAB_00395485;
  }
  if (local_24 == 0x150) {
LAB_003931a1:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"spvSubgroupAllEqual");
    goto LAB_00395485;
  }
  if (local_24 == 0x151) {
LAB_00392d65:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
               "spvSubgroupBroadcast");
    goto LAB_00395485;
  }
  if (local_24 == 0x152) {
LAB_00392da0:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"spvSubgroupBroadcastFirst");
  }
  else {
    if (local_24 != 0x153) {
      if (local_24 == 0x154) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                   this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotBitExtract");
        goto LAB_00395485;
      }
      if (local_24 == 0x155) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvSubgroupBallotBitExtract");
        goto LAB_00395485;
      }
      if (local_24 == 0x156) {
        uVar7 = (ulong)id;
        id = id + 1;
        SVar1 = pSStack_20[uVar7];
        if (SVar1 == CrossDevice) {
          CompilerGLSL::emit_binary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                     this->builtin_subgroup_size_id,"spvSubgroupBallotBitCount");
        }
        else if (SVar1 == Device) {
          CompilerGLSL::emit_binary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                     this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotInclusiveBitCount");
        }
        else {
          if (SVar1 != ScopeWorkgroup) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid BitCount operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_binary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                     this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotExclusiveBitCount");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x157) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                   this->builtin_subgroup_size_id,"spvSubgroupBallotFindLSB");
        goto LAB_00395485;
      }
      if (local_24 == 0x158) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],
                   this->builtin_subgroup_size_id,"spvSubgroupBallotFindMSB");
        goto LAB_00395485;
      }
      if (local_24 == 0x159) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvSubgroupShuffle");
        goto LAB_00395485;
      }
      if (local_24 == 0x15a) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvSubgroupShuffleXor");
        goto LAB_00395485;
      }
      if (local_24 == 0x15b) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvSubgroupShuffleUp");
        goto LAB_00395485;
      }
      if (local_24 == 0x15c) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvSubgroupShuffleDown");
        goto LAB_00395485;
      }
      if (local_24 == 0x15d) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_sum");
        }
        else if (SVar1 == Device) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_inclusive_sum");
        }
        else if (SVar1 == ScopeWorkgroup) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_exclusive_sum");
        }
        else {
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_sum");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x15e) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_sum");
        }
        else if (SVar1 == Device) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_inclusive_sum");
        }
        else if (SVar1 == ScopeWorkgroup) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_exclusive_sum");
        }
        else {
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_sum");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x15f) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_product");
        }
        else if (SVar1 == Device) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_inclusive_product");
        }
        else if (SVar1 == ScopeWorkgroup) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_exclusive_product");
        }
        else {
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_product");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x160) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_product");
        }
        else if (SVar1 == Device) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_inclusive_product");
        }
        else if (SVar1 == ScopeWorkgroup) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],
                     "simd_prefix_exclusive_product");
        }
        else {
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_product");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x161) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_min",op_idx,
                     op_idx);
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_min",op_idx,
                     op_idx);
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x162) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_min",
                     result_type,result_type);
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_min",result_type,
                     result_type);
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x163) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_min");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_min");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x164) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_max",op_idx,
                     op_idx);
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_max",op_idx,
                     op_idx);
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x165) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_max",
                     result_type,result_type);
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op_cast
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_max",result_type,
                     result_type);
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x166) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_max");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_max");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x167) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_and");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_and");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x168) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_or");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr."
                      );
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr."
                      );
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_or");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x169) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_xor");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_xor");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x16a) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_and");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_and");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x16b) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_or");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr."
                      );
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr."
                      );
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_or");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x16c) {
        uVar8 = id + 1;
        SVar1 = pSStack_20[id];
        if (SVar1 == CrossDevice) {
          id = uVar8;
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[uVar8],"simd_xor");
        }
        else {
          if (SVar1 == Device) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 == ScopeWorkgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,
                       "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (SVar1 != ScopeSubgroup) {
            id = uVar8;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar6 = id + 2;
          id = uVar8;
          uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[uVar6]);
          if (uVar4 != 4) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Metal only supports quad ClusteredReduce.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          CompilerGLSL::emit_unary_func_op
                    (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"quad_xor");
        }
        goto LAB_00395485;
      }
      if (local_24 == 0x16d) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvQuadBroadcast");
        goto LAB_00395485;
      }
      if (local_24 == 0x16e) {
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],pSStack_20[id + 1],
                   "spvQuadSwap");
        goto LAB_00395485;
      }
      if (local_24 != 0x1145) {
        if (local_24 != 0x1146) {
          if (local_24 == 0x114c) goto LAB_003930d5;
          if (local_24 == 0x114d) goto LAB_0039313b;
          if (local_24 == 0x114e) goto LAB_003931a1;
          if (local_24 != 0x1150) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid opcode for subgroup.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          goto LAB_00392d65;
        }
        goto LAB_00392da0;
      }
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_74,pSStack_20[id],"spvSubgroupBallot");
  }
LAB_00395485:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,local_74);
  return;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (msl_options.emulate_subgroups)
	{
		// In this mode, only the GroupNonUniform cap is supported. The only op
		// we need to handle, then, is OpGroupNonUniformElect.
		if (op != OpGroupNonUniformElect)
			SPIRV_CROSS_THROW("Subgroup emulation does not support operations other than Elect.");
		// In this mode, the subgroup size is assumed to be one, so every invocation
		// is elected.
		emit_op(ops[0], ops[1], "true", true);
		return;
	}

	// Metal 2.0 is required. iOS only supports quad ops on 11.0 (2.0), with
	// full support in 13.0 (2.2). macOS only supports broadcast and shuffle on
	// 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that Apple GPUs before A13 make no distinction between a quad-group
	// and a SIMD-group; all SIMD-groups are quad-groups on those.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios() && (!msl_options.supports_msl_version(2, 3) || !msl_options.ios_use_simdgroup_functions))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up.");
		case OpGroupNonUniformBroadcastFirst:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("BroadcastFirst on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformElect:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Elect on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformBallotBitCount:
		case OpSubgroupBallotKHR:
		case OpSubgroupAllKHR:
		case OpSubgroupAnyKHR:
		case OpSubgroupAllEqualKHR:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Ballot ops on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	uint32_t op_idx = 0;
	uint32_t result_type = ops[op_idx++];
	uint32_t id = ops[op_idx++];

	Scope scope;
	switch (op)
	{
	case OpSubgroupBallotKHR:
	case OpSubgroupFirstInvocationKHR:
	case OpSubgroupReadInvocationKHR:
	case OpSubgroupAllKHR:
	case OpSubgroupAnyKHR:
	case OpSubgroupAllEqualKHR:
		// These earlier instructions don't have the scope operand.
		scope = ScopeSubgroup;
		break;
	default:
		scope = static_cast<Scope>(evaluate_constant_u32(ops[op_idx++]));
		break;
	}
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		if (msl_options.use_quadgroup_operation())
			emit_op(result_type, id, "quad_is_first()", false);
		else
			emit_op(result_type, id, "simd_is_first()", false);
		break;

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[op_idx++]);
		switch (operation)
		{
		case GroupOperationReduce:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotBitCount");
			break;
		case GroupOperationInclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
			break;
		case GroupOperationExclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		}
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
	case OpSubgroupAllKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_all");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_all");
		break;

	case OpGroupNonUniformAny:
	case OpSubgroupAnyKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_any");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[op_idx++]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[op_idx + 1]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}